

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

VmBlock * GetLoopContinueBlock(VmModule *module,uint depth)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  if (depth != 0) {
    uVar1 = (module->loopInfo).count;
    uVar2 = 0;
    uVar3 = uVar1;
    while (uVar3 = uVar3 - 1, uVar3 < uVar1) {
      if ((module->loopInfo).data[uVar3].continueBlock != (VmBlock *)0x0) {
        uVar2 = uVar2 + 1;
        if (uVar2 == depth) {
          return (module->loopInfo).data[uVar3].continueBlock;
        }
      }
    }
  }
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x199,
                "T &SmallArray<VmModule::LoopInfo, 32>::operator[](unsigned int) [T = VmModule::LoopInfo, N = 32]"
               );
}

Assistant:

VmBlock* GetLoopContinueBlock(VmModule *module, unsigned depth)
{
	unsigned pos = module->loopInfo.size();

	for(unsigned i = 0; i < depth; i++)
	{
		pos--;

		while(!module->loopInfo[pos].continueBlock)
			pos--;
	}

	return module->loopInfo[pos].continueBlock;
}